

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ListBoxHeader(char *label,int items_count,int height_in_items)

{
  float fVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  int iVar4;
  float fVar5;
  ImVec2 local_20;
  
  pIVar2 = GImGui;
  iVar4 = 7;
  if (items_count < 7) {
    iVar4 = items_count;
  }
  if (-1 < height_in_items) {
    iVar4 = height_in_items;
  }
  local_20.x = 0.0;
  fVar5 = GetTextLineHeightWithSpacing();
  fVar1 = (pIVar2->Style).FramePadding.y;
  local_20.y = fVar5 * ((float)iVar4 + 0.25) + fVar1 + fVar1;
  bVar3 = BeginListBox(label,&local_20);
  return bVar3;
}

Assistant:

bool ImGui::ListBoxHeader(const char* label, int items_count, int height_in_items)
{
    // If height_in_items == -1, default height is maximum 7.
    ImGuiContext& g = *GImGui;
    float height_in_items_f = (height_in_items < 0 ? ImMin(items_count, 7) : height_in_items) + 0.25f;
    ImVec2 size;
    size.x = 0.0f;
    size.y = GetTextLineHeightWithSpacing() * height_in_items_f + g.Style.FramePadding.y * 2.0f;
    return BeginListBox(label, size);
}